

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_namelist.cc
# Opt level: O0

MissingListType * ctemplate::TemplateNamelist::GetMissingList_abi_cxx11_(bool refresh)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  ulong uVar3;
  char *filename;
  reference pvVar4;
  ostream *poVar5;
  iterator __first;
  iterator __last;
  allocator local_79;
  string local_78 [48];
  string local_48 [8];
  string path;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_28;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_20;
  const_iterator iter;
  NameListType *the_list;
  bool refresh_local;
  
  the_list._7_1_ = refresh;
  if (missing_list__abi_cxx11_ ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    pvVar2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)operator_new(0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(pvVar2);
    the_list._7_1_ = 1;
    missing_list__abi_cxx11_ = pvVar2;
  }
  if ((the_list._7_1_ & 1) != 0) {
    iter.
    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
    ._M_cur = (_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               )GetList_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(missing_list__abi_cxx11_);
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate::StringHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(iter.
                 super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ._M_cur);
    while( true ) {
      local_28._M_cur =
           (__node_type *)
           std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate::StringHash,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(iter.
                 super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ._M_cur);
      bVar1 = std::__detail::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      std::__detail::
      _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator*((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                   *)&local_20);
      Template::FindTemplateFilename(local_48);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        filename = (char *)std::__cxx11::string::c_str();
        bVar1 = File::Readable(filename);
        if (!bVar1) goto LAB_0017b97b;
      }
      else {
LAB_0017b97b:
        pvVar2 = missing_list__abi_cxx11_;
        pvVar4 = std::__detail::
                 _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                 ::operator*((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                              *)&local_20);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar2,pvVar4);
        poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR");
        poVar5 = std::operator<<(poVar5,": ");
        poVar5 = std::operator<<(poVar5,"Template file missing: ");
        pvVar4 = std::__detail::
                 _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                 ::operator*((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                              *)&local_20);
        poVar5 = std::operator<<(poVar5,(string *)pvVar4);
        poVar5 = std::operator<<(poVar5," at path: ");
        uVar3 = std::__cxx11::string::empty();
        bVar1 = (uVar3 & 1) != 0;
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_78,"(empty path)",&local_79);
        }
        else {
          std::__cxx11::string::string(local_78,(string *)local_48);
        }
        poVar5 = std::operator<<(poVar5,local_78);
        std::operator<<(poVar5,"\n");
        std::__cxx11::string::~string(local_78);
        if (bVar1) {
          std::allocator<char>::~allocator((allocator<char> *)&local_79);
        }
      }
      std::__cxx11::string::~string((string *)local_48);
      std::__detail::
      _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator++((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    *)&local_20);
    }
  }
  __first = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(missing_list__abi_cxx11_);
  __last = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(missing_list__abi_cxx11_);
  std::
  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__last._M_current);
  return missing_list__abi_cxx11_;
}

Assistant:

const TemplateNamelist::MissingListType& TemplateNamelist::GetMissingList(
    bool refresh) {
  if (!missing_list_) {
    missing_list_ = new MissingListType;
    refresh = true;  // always refresh the first time
  }

  if (refresh) {
    const NameListType& the_list = TemplateNamelist::GetList();
    missing_list_->clear();

    for (NameListType::const_iterator iter = the_list.begin();
         iter != the_list.end();
         ++iter) {
      const string path = Template::FindTemplateFilename(*iter);
      if (path.empty() || !File::Readable(path.c_str())) {
        missing_list_->push_back(*iter);
        LOG(ERROR) << "Template file missing: " << *iter
                   << " at path: " << (path.empty() ? "(empty path)" : path)
                   << "\n";
      }
    }
  }

  sort(missing_list_->begin(), missing_list_->end());
  return *missing_list_;
}